

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O3

void fsnav_linal_msq1T_u(double *res,double *v,size_t m,size_t n)

{
  size_t sVar1;
  double *pdVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  double dVar6;
  
  if (n != 0) {
    sVar4 = 0;
    lVar3 = 0;
    pdVar2 = v;
    sVar1 = sVar4;
    do {
      do {
        res[lVar3] = 0.0;
        if (m * n != 0) {
          dVar6 = 0.0;
          uVar5 = 0;
          do {
            dVar6 = dVar6 + pdVar2[uVar5] * v[uVar5];
            res[lVar3] = dVar6;
            uVar5 = uVar5 + n;
          } while (uVar5 < m * n);
        }
        sVar4 = sVar4 + 1;
        lVar3 = lVar3 + 1;
        v = v + 1;
      } while (sVar4 < n);
      sVar4 = sVar1 + 1;
      v = pdVar2 + 1;
      pdVar2 = v;
      sVar1 = sVar4;
    } while (sVar4 != n);
  }
  return;
}

Assistant:

void fsnav_linal_msq1T_u(double* res, double* v, const size_t m, const size_t n)
{
	size_t j, j1, i, k, mn;

	mn = m*n;
	for (j = 0, j1 = 0, k = 0; j < n; j++)
		for (j1 = j; j1 < n; j1++, k++)
			for (i = 0, res[k] = 0; i < mn; i += n)
				res[k] += v[i+j]*v[i+j1];
}